

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

int __thiscall
libchars::terminal_driver::cursor_position
          (terminal_driver *this,size_t *x,size_t *y,ssize_t timeout_ms)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  uint64_t t_msec_start;
  uint64_t t_msec_now;
  timeval T_now;
  size_t rbuf_copy_from;
  size_t rbuf_copy_to;
  size_t sStack_68;
  uint8_t c;
  size_t rbuf_found;
  size_t rbuf_search;
  size_t rbuf_mask;
  undefined1 auStack_48 [4];
  anon_enum_32 seq_state;
  timeval T_start;
  ssize_t sStack_30;
  int r;
  ssize_t timeout_ms_local;
  size_t *y_local;
  size_t *x_local;
  terminal_driver *this_local;
  
  *y = 0;
  *x = 0;
  sStack_30 = timeout_ms;
  if (timeout_ms < 0) {
    sStack_30 = 5000;
  }
  sVar3 = write(this,0x13ebf0,(void *)0x4,timeout_ms);
  T_start.tv_usec._4_4_ = (int)sVar3;
  this_local._4_4_ = T_start.tv_usec._4_4_;
  if (T_start.tv_usec._4_4_ == 0) {
    memset(auStack_48,0,0x10);
    gettimeofday((timeval *)auStack_48,(__timezone_ptr_t)0x0);
    do {
      do {
        if (this->rbuf_deq + 6 <= this->rbuf_enq) {
          rbuf_mask._4_4_ = 0;
          uVar4 = this->rbuf_size - 1;
          sStack_68 = this->rbuf_size;
          for (rbuf_found = this->rbuf_deq; rbuf_found < this->rbuf_enq; rbuf_found = rbuf_found + 1
              ) {
            bVar1 = this->rbuf[rbuf_found & uVar4];
            switch(rbuf_mask._4_4_) {
            case 0:
              if (bVar1 == 0x1b) {
                rbuf_mask._4_4_ = 1;
                sStack_68 = rbuf_found;
              }
              break;
            case 1:
              if (bVar1 == 0x5b) {
                rbuf_mask._4_4_ = 2;
              }
              else {
                rbuf_mask._4_4_ = 0;
                sStack_68 = this->rbuf_size;
              }
              break;
            case 2:
              if (bVar1 == 0x3b) {
                rbuf_mask._4_4_ = 3;
              }
              else {
                iVar2 = isdigit((uint)bVar1);
                if (iVar2 == 0) {
                  rbuf_mask._4_4_ = 0;
                  sStack_68 = this->rbuf_size;
                }
                else {
                  *y = *y * 10 + (long)(int)(bVar1 - 0x30);
                }
              }
              break;
            case 3:
              if (bVar1 == 0x52) {
                rbuf_copy_from = sStack_68;
                for (T_now.tv_usec = rbuf_found + 1; (ulong)T_now.tv_usec < this->rbuf_enq;
                    T_now.tv_usec = T_now.tv_usec + 1) {
                  this->rbuf[rbuf_copy_from & uVar4] = this->rbuf[T_now.tv_usec & uVar4];
                  rbuf_copy_from = rbuf_copy_from + 1;
                }
                this->rbuf_enq = this->rbuf_enq - ((rbuf_found + 1) - sStack_68);
                return 0;
              }
              iVar2 = isdigit((uint)bVar1);
              if (iVar2 == 0) {
                rbuf_mask._4_4_ = 0;
                sStack_68 = this->rbuf_size;
              }
              else {
                *x = *x * 10 + (long)(int)(bVar1 - 0x30);
              }
            }
          }
        }
        T_start.tv_usec._4_4_ = read_characters(this,true);
        if (T_start.tv_usec._4_4_ < 0) {
          return T_start.tv_usec._4_4_;
        }
      } while (T_start.tv_usec._4_4_ != 0);
      iVar2 = gettimeofday((timeval *)&t_msec_now,(__timezone_ptr_t)0x0);
      if (iVar2 != 0) {
        return -1;
      }
    } while (t_msec_now * 1000 + (ulong)T_now.tv_sec / 1000 <
             _auStack_48 * 1000 + (ulong)T_start.tv_sec / 1000 + sStack_30);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int terminal_driver::cursor_position(size_t &x, size_t &y, ssize_t timeout_ms)
    {
        x = y = 0;

        //XXX: do not check for 'control_enabled' because this function is used to determine 'control_enabled'

        if (timeout_ms < 0)
            timeout_ms = LC_CURSOR_POSITION_READ_TIMEOUT_ms;

        int r = write("\x1b[6n", 4);
        if (r != 0)
            return r;

        struct timeval T_start = { 0, 0 };
        gettimeofday(&T_start, NULL);

        while (true) {
            // search for pattern: ^[yyy;xxxR  (minimum of 6 characters)
            if (rbuf_enq >= (rbuf_deq + 6)) {
                enum { WAIT_ESC0, WAIT_ESC1, WAIT_SEMI, WAIT_TERM } seq_state = WAIT_ESC0;
                size_t rbuf_mask = (rbuf_size - 1);
                size_t rbuf_search = rbuf_deq;
                size_t rbuf_found = rbuf_size;
                while (rbuf_search < rbuf_enq) {
                    uint8_t c = *(rbuf + (rbuf_search & rbuf_mask));
                    switch (seq_state) {
                    case WAIT_ESC0:
                        if (c == 0x1b) {
                            seq_state = WAIT_ESC1;
                            rbuf_found = rbuf_search;
                        }
                        break;
                    case WAIT_ESC1:
                        if (c == '[') {
                            seq_state = WAIT_SEMI;
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_SEMI:
                        if (c == ';') {
                            seq_state = WAIT_TERM;
                        }
                        else if (isdigit(c)) {
                            y = y*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_TERM:
                        if (c == 'R') {
                            // pattern found; remove bytes from buffer
                            ++rbuf_search;
                            size_t rbuf_copy_to = rbuf_found;
                            size_t rbuf_copy_from = rbuf_search;
                            while (rbuf_copy_from < rbuf_enq) {
                                *(rbuf + (rbuf_copy_to & rbuf_mask)) = *(rbuf + (rbuf_copy_from & rbuf_mask));
                                ++rbuf_copy_to;
                                ++rbuf_copy_from;
                            }
                            rbuf_enq -= (rbuf_search - rbuf_found);
                            return 0;
                        }
                        else if (isdigit(c)) {
                            x = x*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    }
                    ++rbuf_search;
                }
            }
            // pattern not found; need more characters
            r = read_characters(true);
            if (r < 0)
                return r;
            else if (r == 0) {
                // timeout logic
                struct timeval T_now;
                if (gettimeofday(&T_now, NULL) == 0) {
                    uint64_t t_msec_now = T_now.tv_sec * 1000ULL + T_now.tv_usec/1000ULL;
                    uint64_t t_msec_start = T_start.tv_sec * 1000ULL + T_start.tv_usec/1000ULL;
                    if (t_msec_now >= (t_msec_start + timeout_ms))
                        return -1;
                }
                else {
                    return -1;
                }
            }
        }
    }